

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O3

XMLSize_t __thiscall
xercesc_4_0::XPathScanner::scanNumber
          (XPathScanner *this,XMLCh *data,XMLSize_t endOffset,XMLSize_t currentOffset,
          ValueVectorOf<int> *tokens)

{
  XMLCh XVar1;
  int iVar2;
  RuntimeException *this_00;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  int iVar5;
  
  iVar5 = 0;
  do {
    XVar1 = data[currentOffset];
    if (9 < (ushort)(XVar1 + L'￐')) {
      XVar3 = currentOffset;
      if (((ushort)XVar1 == 0x2e) && (XVar3 = currentOffset + 1, XVar3 < endOffset)) {
        iVar2 = 0;
        goto LAB_00310d08;
      }
      break;
    }
    iVar5 = (uint)(ushort)XVar1 + iVar5 * 10 + -0x30;
    currentOffset = currentOffset + 1;
    XVar3 = endOffset;
  } while (endOffset != currentOffset);
  goto LAB_00310d2e;
  while( true ) {
    iVar2 = (uint)(ushort)data[XVar3] + iVar2 * 10 + -0x30;
    XVar3 = XVar3 + 1;
    XVar4 = endOffset;
    if (endOffset == XVar3) break;
LAB_00310d08:
    XVar4 = XVar3;
    if (9 < (ushort)(data[XVar3] + L'￐')) break;
  }
  XVar3 = XVar4;
  if (iVar2 != 0) {
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
               ,0x580,XPath_FindSolution,tokens->fMemoryManager);
    __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
  }
LAB_00310d2e:
  ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
  XVar4 = tokens->fCurCount;
  tokens->fCurCount = XVar4 + 1;
  tokens->fElemList[XVar4] = iVar5;
  ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
  XVar4 = tokens->fCurCount;
  tokens->fCurCount = XVar4 + 1;
  tokens->fElemList[XVar4] = 0;
  return XVar3;
}

Assistant:

XMLSize_t XPathScanner::scanNumber(const XMLCh* const data,
                             const XMLSize_t endOffset,
                             XMLSize_t currentOffset,
                             ValueVectorOf<int>* const tokens) {

    XMLCh ch = data[currentOffset];
    int   whole = 0;
    int   part = 0;

    while (ch >= chDigit_0 && ch <= chDigit_9) {

        whole = (whole * 10) + (ch - chDigit_0);

        if (++currentOffset == endOffset) {
            break;
        }

        ch = data[currentOffset];
    }

    if (ch == chPeriod) {

        if (++currentOffset < endOffset) {

            ch = data[currentOffset];

            while (ch >= chDigit_0 && ch <= chDigit_9) {

                part = (part * 10) + (ch - chDigit_0);

                if (++currentOffset == endOffset) {
                    break;
                }

                ch = data[currentOffset];
            }

            if (part != 0) {
                ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::XPath_FindSolution, tokens->getMemoryManager());
            }
        }
    }

    tokens->addElement(whole);
    tokens->addElement(part);

    return currentOffset;
}